

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O3

Aig_ManCut_t * Aig_ManCutStart(Aig_Man_t *pMan,int nCutsMax,int nLeafMax,int fTruth,int fVerbose)

{
  uint uVar1;
  Aig_ManCut_t *pAVar2;
  Aig_Cut_t **ppAVar3;
  Aig_MmFixed_t *pAVar4;
  uint *puVar5;
  byte bVar6;
  int iVar7;
  
  if (nCutsMax < 2) {
    __assert_fail("nCutsMax >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                  ,0x31,"Aig_ManCut_t *Aig_ManCutStart(Aig_Man_t *, int, int, int, int)");
  }
  if (nLeafMax < 0x11) {
    pAVar2 = (Aig_ManCut_t *)calloc(1,0x50);
    pAVar2->nCutsMax = nCutsMax;
    pAVar2->nLeafMax = nLeafMax;
    pAVar2->fTruth = fTruth;
    pAVar2->fVerbose = fVerbose;
    pAVar2->pAig = pMan;
    ppAVar3 = (Aig_Cut_t **)calloc((long)pMan->vObjs->nSize,8);
    pAVar2->pCuts = ppAVar3;
    bVar6 = (char)nLeafMax - 5;
    uVar1 = 1 << (bVar6 & 0x1f);
    if (nLeafMax < 6) {
      uVar1 = 1;
    }
    if (nLeafMax < 6) {
      bVar6 = 0;
    }
    pAVar2->nTruthWords = uVar1;
    iVar7 = (fTruth * 4 << (bVar6 & 0x1f)) + nLeafMax * 4 + 0x18;
    pAVar2->nCutSize = iVar7;
    pAVar4 = Aig_MmFixedStart(iVar7 * nCutsMax,0x200);
    pAVar2->pMemCuts = pAVar4;
    if (fTruth != 0) {
      puVar5 = (uint *)malloc((ulong)(uVar1 * 4) << 2);
      pAVar2->puTemp[0] = puVar5;
      puVar5 = puVar5 + uVar1;
      pAVar2->puTemp[1] = puVar5;
      pAVar2->puTemp[2] = puVar5 + uVar1;
      pAVar2->puTemp[3] = puVar5 + uVar1 + uVar1;
    }
    return pAVar2;
  }
  __assert_fail("nLeafMax <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                ,0x32,"Aig_ManCut_t *Aig_ManCutStart(Aig_Man_t *, int, int, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the cut sweeping manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_ManCut_t * Aig_ManCutStart( Aig_Man_t * pMan, int nCutsMax, int nLeafMax, int fTruth, int fVerbose )
{
    Aig_ManCut_t * p;
    assert( nCutsMax >= 2  );
    assert( nLeafMax <= 16 );
    // allocate the fraiging manager
    p = ABC_ALLOC( Aig_ManCut_t, 1 );
    memset( p, 0, sizeof(Aig_ManCut_t) );
    p->nCutsMax = nCutsMax;
    p->nLeafMax = nLeafMax;
    p->fTruth   = fTruth;
    p->fVerbose = fVerbose;
    p->pAig     = pMan;
    p->pCuts    = ABC_CALLOC( Aig_Cut_t *, Aig_ManObjNumMax(pMan) );
    // allocate memory manager
    p->nTruthWords = Abc_TruthWordNum(nLeafMax);
    p->nCutSize = sizeof(Aig_Cut_t) + sizeof(int) * nLeafMax + fTruth * sizeof(unsigned) * p->nTruthWords;
    p->pMemCuts = Aig_MmFixedStart( p->nCutSize * p->nCutsMax, 512 );
    // room for temporary truth tables
    if ( fTruth )
    {
        p->puTemp[0] = ABC_ALLOC( unsigned, 4 * p->nTruthWords );
        p->puTemp[1] = p->puTemp[0] + p->nTruthWords;
        p->puTemp[2] = p->puTemp[1] + p->nTruthWords;
        p->puTemp[3] = p->puTemp[2] + p->nTruthWords;
    }
    return p;
}